

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O2

fdb_status fdb_kvs_cmp_check(fdb_kvs_handle *handle)

{
  uint8_t uVar1;
  fdb_file_handle *pfVar2;
  filemgr *pfVar3;
  fdb_custom_cmp_variable p_Var4;
  void *pvVar5;
  list_elem *plVar6;
  list_elem *plVar7;
  list_elem *plVar8;
  ulong uVar9;
  fdb_custom_cmp_variable p_Var10;
  avl_node *paVar11;
  int iVar12;
  fdb_status fVar13;
  avl_node *paVar14;
  avl_node *paVar15;
  char *pcVar16;
  kvs_header *pkVar17;
  size_t line_number;
  char *pcVar18;
  list *plVar19;
  kvs_node query;
  
  pfVar2 = handle->fhandle;
  pfVar3 = handle->file;
  pthread_spin_lock(&pfVar3->kv_header->lock);
  pkVar17 = pfVar3->kv_header;
  uVar1 = pkVar17->custom_cmp_enabled;
  p_Var4 = pkVar17->default_kvs_cmp;
  pvVar5 = pkVar17->default_kvs_cmp_param;
  plVar19 = pfVar2->cmp_func_list;
  if (plVar19 != (list *)0x0) {
    (handle->kvs_config).custom_cmp = (fdb_custom_cmp_variable)0x0;
    (handle->kvs_config).custom_cmp_param = (void *)0x0;
    while (plVar6 = plVar19->head, plVar6 != (list_elem *)0x0) {
      plVar7 = plVar6[-2].next;
      if (plVar7 == (list_elem *)0x0) {
        pkVar17 = pfVar3->kv_header;
LAB_0013dbc6:
        plVar7 = plVar6[-1].prev;
        (handle->kvs_config).custom_cmp = (fdb_custom_cmp_variable)plVar7;
        plVar8 = plVar6[-1].next;
        (handle->kvs_config).custom_cmp_param = plVar8;
        pkVar17->default_kvs_cmp = (fdb_custom_cmp_variable)plVar7;
        pkVar17->default_kvs_cmp_param = plVar8;
LAB_0013dbde:
        pkVar17->custom_cmp_enabled = '\x01';
      }
      else {
        iVar12 = strcmp((char *)plVar7,"default");
        pkVar17 = pfVar3->kv_header;
        if (iVar12 == 0) goto LAB_0013dbc6;
        query.kvs_name = (char *)plVar7;
        paVar14 = avl_search(pkVar17->idx_name,&query.avl_name,_kvs_cmp_name);
        if (paVar14 != (avl_node *)0x0) {
          if (paVar14[-6].right == (avl_node *)0x0) {
            paVar11 = (avl_node *)plVar6[-1].next;
            paVar14[-6].right = (avl_node *)plVar6[-1].prev;
            paVar14[-5].parent = paVar11;
          }
          pkVar17 = pfVar3->kv_header;
          goto LAB_0013dbde;
        }
      }
      plVar19 = (list *)&plVar6->next;
    }
  }
  uVar9 = pfVar2->flags;
  if ((uVar9 & 2) == 0) {
    pkVar17 = pfVar3->kv_header;
  }
  else {
    p_Var10 = (handle->kvs_config).custom_cmp;
    pkVar17 = pfVar3->kv_header;
    if ((uVar9 & 4) == 0) {
      if (p_Var10 != (fdb_custom_cmp_variable)0x0) {
        pkVar17->custom_cmp_enabled = uVar1;
        pkVar17->default_kvs_cmp = p_Var4;
        pkVar17->default_kvs_cmp_param = pvVar5;
        pthread_spin_unlock(&pkVar17->lock);
        pcVar16 = _fdb_kvs_get_name(handle,handle->file);
        pcVar18 = "default";
        if (pcVar16 != (char *)0x0) {
          pcVar18 = pcVar16;
        }
        pcVar16 = 
        "Error! Tried to open a KV store \'%s\', which was created without custom compare function, by passing custom compare function."
        ;
        line_number = 0x1a2;
        goto LAB_0013de1f;
      }
    }
    else if (p_Var10 == (fdb_custom_cmp_variable)0x0) {
      pkVar17->custom_cmp_enabled = uVar1;
      pkVar17->default_kvs_cmp = p_Var4;
      pkVar17->default_kvs_cmp_param = pvVar5;
      pthread_spin_unlock(&pkVar17->lock);
      pcVar16 = _fdb_kvs_get_name(handle,handle->file);
      pcVar18 = "default";
      if (pcVar16 != (char *)0x0) {
        pcVar18 = pcVar16;
      }
      pcVar16 = 
      "Error! Tried to open a KV store \'%s\', which was created with custom compare function enabled, without passing the same custom compare function."
      ;
      line_number = 400;
      goto LAB_0013de1f;
    }
  }
  paVar14 = avl_first(pkVar17->idx_name);
  do {
    while( true ) {
      if (paVar14 == (avl_node *)0x0) {
        pthread_spin_unlock(&pfVar3->kv_header->lock);
        return FDB_RESULT_SUCCESS;
      }
      paVar15 = avl_next(paVar14);
      paVar11 = paVar14 + -6;
      if (((ulong)paVar14[-6].left & 1) != 0) break;
      paVar14 = paVar15;
      if (paVar11->right != (avl_node *)0x0) {
        pkVar17 = pfVar3->kv_header;
        pkVar17->custom_cmp_enabled = uVar1;
        pkVar17->default_kvs_cmp = p_Var4;
        pkVar17->default_kvs_cmp_param = pvVar5;
        pthread_spin_unlock(&pkVar17->lock);
        pcVar16 = _fdb_kvs_get_name(handle,handle->file);
        pcVar18 = "default";
        if (pcVar16 != (char *)0x0) {
          pcVar18 = pcVar16;
        }
        pcVar16 = 
        "Error! Tried to open a KV store \'%s\', which was created without custom compare function, by passing custom compare function."
        ;
        line_number = 0x1ce;
        goto LAB_0013de1f;
      }
    }
    paVar14 = paVar15;
  } while (paVar11->right != (avl_node *)0x0);
  pkVar17 = pfVar3->kv_header;
  pkVar17->custom_cmp_enabled = uVar1;
  pkVar17->default_kvs_cmp = p_Var4;
  pkVar17->default_kvs_cmp_param = pvVar5;
  pthread_spin_unlock(&pkVar17->lock);
  pcVar16 = _fdb_kvs_get_name(handle,handle->file);
  pcVar18 = "default";
  if (pcVar16 != (char *)0x0) {
    pcVar18 = pcVar16;
  }
  pcVar16 = 
  "Error! Tried to open a KV store \'%s\', which was created with custom compare function enabled, without passing the same custom compare function."
  ;
  line_number = 0x1bc;
LAB_0013de1f:
  fVar13 = fdb_log_impl(&handle->log_callback,2,FDB_RESULT_INVALID_CMP_FUNCTION,
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/kv_instance.cc"
                        ,"fdb_kvs_cmp_check",line_number,pcVar16,pcVar18);
  return fVar13;
}

Assistant:

fdb_status fdb_kvs_cmp_check(fdb_kvs_handle *handle)
{
    int ori_flag;
    fdb_file_handle *fhandle = handle->fhandle;
    fdb_custom_cmp_variable ori_custom_cmp;
    void* ori_custom_param;
    struct filemgr *file = handle->file;
    struct cmp_func_node *cmp_node;
    struct kvs_node *kvs_node, query;
    struct list_elem *e;
    struct avl_node *a;

    spin_lock(&file->kv_header->lock);
    ori_flag = file->kv_header->custom_cmp_enabled;
    ori_custom_cmp = file->kv_header->default_kvs_cmp;
    ori_custom_param = file->kv_header->default_kvs_cmp_param;

    // Assign from `fhandle->cmp_func_list` to `file->kv_header`.
    if (fhandle->cmp_func_list) {
        handle->kvs_config.custom_cmp = NULL;
        handle->kvs_config.custom_cmp_param = NULL;

        e = list_begin(fhandle->cmp_func_list);
        while (e) {
            cmp_node = _get_entry(e, struct cmp_func_node, le);
            if ( cmp_node->kvs_name == NULL ||
                 !strcmp(cmp_node->kvs_name, default_kvs_name) ) { // default KVS
                handle->kvs_config.custom_cmp = cmp_node->func;
                handle->kvs_config.custom_cmp_param = cmp_node->user_param;
                file->kv_header->default_kvs_cmp = cmp_node->func;
                file->kv_header->default_kvs_cmp_param = cmp_node->user_param;
                file->kv_header->custom_cmp_enabled = 1;
            } else {
                // search by name
                query.kvs_name = cmp_node->kvs_name;
                a = avl_search(file->kv_header->idx_name,
                               &query.avl_name,
                               _kvs_cmp_name);
                if (a) { // found
                    kvs_node = _get_entry(a, struct kvs_node, avl_name);
                    if (!kvs_node->custom_cmp) {
                        kvs_node->custom_cmp = cmp_node->func;
                        kvs_node->user_param = cmp_node->user_param;
                    }
                    file->kv_header->custom_cmp_enabled = 1;
                }
            }
            e = list_next(&cmp_node->le);
        }
    }

    // first check the default KVS
    // 1. root handle has not been opened yet: don't care
    // 2. root handle was opened before: must match the flag
    if (fhandle->flags & FHANDLE_ROOT_INITIALIZED) {
        if (fhandle->flags & FHANDLE_ROOT_CUSTOM_CMP &&
            handle->kvs_config.custom_cmp == NULL) {
            // custom cmp function was assigned before,
            // but no custom cmp function is assigned
            file->kv_header->custom_cmp_enabled = ori_flag;
            file->kv_header->default_kvs_cmp = ori_custom_cmp;
            file->kv_header->default_kvs_cmp_param = ori_custom_param;
            spin_unlock(&file->kv_header->lock);
            const char *kvs_name = _fdb_kvs_get_name(handle, handle->file);
            if (!kvs_name) {
                kvs_name = DEFAULT_KVS_NAME;
            }
            return fdb_log(&handle->log_callback, FDB_LOG_ERROR,
                           FDB_RESULT_INVALID_CMP_FUNCTION,
                           "Error! Tried to open a KV store '%s', which was created with "
                           "custom compare function enabled, without passing the same "
                           "custom compare function.", kvs_name);
        }
        if (!(fhandle->flags & FHANDLE_ROOT_CUSTOM_CMP) &&
              handle->kvs_config.custom_cmp) {
            // custom cmp function was not assigned before,
            // but custom cmp function is assigned from user
            file->kv_header->custom_cmp_enabled = ori_flag;
            file->kv_header->default_kvs_cmp = ori_custom_cmp;
            file->kv_header->default_kvs_cmp_param = ori_custom_param;
            spin_unlock(&file->kv_header->lock);
            const char *kvs_name = _fdb_kvs_get_name(handle, handle->file);
            if (!kvs_name) {
                kvs_name = DEFAULT_KVS_NAME;
            }
            return fdb_log(&handle->log_callback, FDB_LOG_ERROR,
                           FDB_RESULT_INVALID_CMP_FUNCTION,
                           "Error! Tried to open a KV store '%s', which was created without "
                           "custom compare function, by passing custom compare function.",
                    kvs_name);
        }
    }

    // next check other KVSs
    a = avl_first(file->kv_header->idx_name);
    while (a) {
        kvs_node = _get_entry(a, struct kvs_node, avl_name);
        a = avl_next(a);

        if (kvs_node->flags & KVS_FLAG_CUSTOM_CMP &&
            kvs_node->custom_cmp == NULL) {
            // custom cmp function was assigned before,
            // but no custom cmp function is assigned
            file->kv_header->custom_cmp_enabled = ori_flag;
            file->kv_header->default_kvs_cmp = ori_custom_cmp;
            file->kv_header->default_kvs_cmp_param = ori_custom_param;
            spin_unlock(&file->kv_header->lock);
            const char *kvs_name = _fdb_kvs_get_name(handle, handle->file);
            if (!kvs_name) {
                kvs_name = DEFAULT_KVS_NAME;
            }
            return fdb_log(&handle->log_callback, FDB_LOG_ERROR,
                           FDB_RESULT_INVALID_CMP_FUNCTION,
                           "Error! Tried to open a KV store '%s', which was created with "
                           "custom compare function enabled, without passing the same "
                           "custom compare function.", kvs_name);
        }
        if (!(kvs_node->flags & KVS_FLAG_CUSTOM_CMP) &&
              kvs_node->custom_cmp) {
            // custom cmp function was not assigned before,
            // but custom cmp function is assigned from user
            file->kv_header->custom_cmp_enabled = ori_flag;
            file->kv_header->default_kvs_cmp = ori_custom_cmp;
            file->kv_header->default_kvs_cmp_param = ori_custom_param;
            spin_unlock(&file->kv_header->lock);
            const char *kvs_name = _fdb_kvs_get_name(handle, handle->file);
            if (!kvs_name) {
                kvs_name = DEFAULT_KVS_NAME;
            }
            return fdb_log(&handle->log_callback, FDB_LOG_ERROR,
                           FDB_RESULT_INVALID_CMP_FUNCTION,
                           "Error! Tried to open a KV store '%s', which was created without "
                           "custom compare function, by passing custom compare function.",
                           kvs_name);
        }
    }

    spin_unlock(&file->kv_header->lock);
    return FDB_RESULT_SUCCESS;
}